

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_do_more(Curl_easy *data,int *completep)

{
  _Bool _Var1;
  CURLcode CVar2;
  _Bool local_41;
  long lStack_40;
  _Bool serv_conned;
  FTP *ftp;
  _Bool complete;
  _Bool connected;
  anon_union_248_5_a113b5f6_for_proto *paStack_30;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *conn;
  int *completep_local;
  Curl_easy *data_local;
  
  ftpc = (ftp_conn *)data->conn;
  paStack_30 = &((connectdata *)ftpc)->proto;
  ftp._4_4_ = CURLE_OK;
  ftp._3_1_ = 0;
  ftp._2_1_ = 0;
  lStack_40 = 0;
  conn = (connectdata *)completep;
  completep_local = (int *)data;
  if (((((connectdata *)ftpc)->bits).tcpconnect[1] & 1U) == 0) {
    _Var1 = Curl_connect_ongoing((connectdata *)ftpc);
    if (_Var1) {
      CVar2 = Curl_proxyCONNECT((Curl_easy *)completep_local,1,(char *)0x0,0);
      return CVar2;
    }
    ftp._4_4_ = Curl_is_connected((Curl_easy *)completep_local,(connectdata *)ftpc,1,
                                  (_Bool *)((long)&ftp + 3));
    if ((ftp._3_1_ & 1) == 0) {
      if (ftp._4_4_ == CURLE_OK) {
        return CURLE_OK;
      }
      if ((paStack_30->ftpc).count1 != 0) {
        return ftp._4_4_;
      }
      (conn->cnnct).state = ~CONNECT_INIT;
      CVar2 = ftp_epsv_disable((Curl_easy *)completep_local,(connectdata *)ftpc);
      return CVar2;
    }
  }
  ftp._4_4_ = Curl_proxy_connect((Curl_easy *)completep_local,1);
  data_local._4_4_ = ftp._4_4_;
  if ((ftp._4_4_ == CURLE_OK) &&
     (((char)ftpc[1].pp.response.tv_usec != '\x02' || (((ulong)ftpc[3].entrypath & 0x1000000) != 0))
     )) {
    if (((*(uint *)((long)&ftpc[3].entrypath + 4) >> 3 & 1) == 0) ||
       ((((ulong)ftpc[3].entrypath & 0x100000000) == 0 ||
        (_Var1 = Curl_connect_ongoing((connectdata *)ftpc), !_Var1)))) {
      lStack_40 = *(long *)(completep_local + 0x66);
      if ((paStack_30->ftpc).state != FTP_STOP) {
        CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
        (conn->cnnct).state = (uint)(ftp._2_1_ & 1);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        if (((paStack_30->ftpc).wait_data_conn & 1U) == 0) {
          return CURLE_OK;
        }
        (conn->cnnct).state = CONNECT_INIT;
        ftp._4_4_ = CURLE_OK;
      }
      if (*(uint *)(lStack_40 + 0x10) < 2) {
        if (((paStack_30->ftpc).wait_data_conn & 1U) == 1) {
          ftp._4_4_ = ReceivedServerConnect((Curl_easy *)completep_local,&local_41);
          if (ftp._4_4_ != CURLE_OK) {
            return ftp._4_4_;
          }
          CVar2 = CURLE_OK;
          if ((local_41 & 1U) != 0) {
            ftp._4_4_ = AcceptServerConnect((Curl_easy *)completep_local);
            (paStack_30->ftpc).wait_data_conn = false;
            if (ftp._4_4_ == CURLE_OK) {
              ftp._4_4_ = InitiateTransfer((Curl_easy *)completep_local);
            }
            if (ftp._4_4_ != CURLE_OK) {
              return ftp._4_4_;
            }
            (conn->cnnct).state = CONNECT_SOCKS_INIT;
            CVar2 = ftp._4_4_;
          }
        }
        else if ((*(ulong *)((long)completep_local + 0xa92) >> 0x1a & 1) == 0) {
          *(undefined8 *)(lStack_40 + 0x18) = 0xffffffffffffffff;
          ftp._4_4_ = Curl_range((Curl_easy *)completep_local);
          if ((ftp._4_4_ == CURLE_OK) && (-1 < *(long *)(completep_local + 0x36))) {
            (paStack_30->ftpc).dont_check = true;
          }
          if (ftp._4_4_ == CURLE_OK) {
            if ((((uint)completep_local[0x4c0] >> 0x10 & 1) == 0) &&
               ((paStack_30->ftpc).file != (char *)0x0)) {
              CVar2 = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,
                                  ((uint)completep_local[0x4c0] >> 0xf & 1) != 0,FTP_RETR_TYPE);
              if (CVar2 != CURLE_OK) {
                return CVar2;
              }
              ftp._4_4_ = CURLE_OK;
            }
            else if (*(int *)(lStack_40 + 0x10) == 0) {
              CVar2 = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,true,
                                  FTP_LIST_TYPE);
              if (CVar2 != CURLE_OK) {
                return CVar2;
              }
              ftp._4_4_ = CURLE_OK;
            }
          }
          CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
          (conn->cnnct).state = (uint)(ftp._2_1_ & 1);
        }
        else {
          ftp._4_4_ = ftp_nb_type((Curl_easy *)completep_local,(connectdata *)ftpc,
                                  ((uint)completep_local[0x4c0] >> 0xf & 1) != 0,FTP_STOR_TYPE);
          if (ftp._4_4_ != CURLE_OK) {
            return ftp._4_4_;
          }
          CVar2 = ftp_multi_statemach((Curl_easy *)completep_local,(_Bool *)((long)&ftp + 2));
          if (((paStack_30->ftpc).wait_data_conn & 1U) == 0) {
            (conn->cnnct).state = (uint)(ftp._2_1_ & 1);
          }
          else {
            (conn->cnnct).state = CONNECT_INIT;
          }
        }
        ftp._4_4_ = CVar2;
        data_local._4_4_ = ftp._4_4_;
      }
      else {
        Curl_setup_transfer((Curl_easy *)completep_local,-1,-1,false,-1);
        if (((paStack_30->ftpc).wait_data_conn & 1U) == 0) {
          (conn->cnnct).state = CONNECT_SOCKS_INIT;
        }
        data_local._4_4_ = ftp._4_4_;
      }
    }
    else {
      data_local._4_4_ = ftp._4_4_;
    }
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_do_more(struct Curl_easy *data, int *completep)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  bool connected = FALSE;
  bool complete = FALSE;

  /* the ftp struct is inited in ftp_connect(). If we are connecting to an HTTP
   * proxy then the state will not be valid until after that connection is
   * complete */
  struct FTP *ftp = NULL;

  /* if the second connection isn't done yet, wait for it */
  if(!conn->bits.tcpconnect[SECONDARYSOCKET]) {
    if(Curl_connect_ongoing(conn)) {
      /* As we're in TUNNEL_CONNECT state now, we know the proxy name and port
         aren't used so we blank their arguments. */
      result = Curl_proxyCONNECT(data, SECONDARYSOCKET, NULL, 0);

      return result;
    }

    result = Curl_is_connected(data, conn, SECONDARYSOCKET, &connected);

    /* Ready to do more? */
    if(connected) {
      DEBUGF(infof(data, "DO-MORE connected phase starts"));
    }
    else {
      if(result && (ftpc->count1 == 0)) {
        *completep = -1; /* go back to DOING please */
        /* this is a EPSV connect failing, try PASV instead */
        return ftp_epsv_disable(data, conn);
      }
      return result;
    }
  }

#ifndef CURL_DISABLE_PROXY
  result = Curl_proxy_connect(data, SECONDARYSOCKET);
  if(result)
    return result;

  if(CONNECT_SECONDARYSOCKET_PROXY_SSL())
    return result;

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy &&
     Curl_connect_ongoing(conn))
    return result;
#endif

  /* Curl_proxy_connect might have moved the protocol state */
  ftp = data->req.p.ftp;

  if(ftpc->state) {
    /* already in a state so skip the initial commands.
       They are only done to kickstart the do_more state */
    result = ftp_multi_statemach(data, &complete);

    *completep = (int)complete;

    /* if we got an error or if we don't wait for a data connection return
       immediately */
    if(result || !ftpc->wait_data_conn)
      return result;

    /* if we reach the end of the FTP state machine here, *complete will be
       TRUE but so is ftpc->wait_data_conn, which says we need to wait for the
       data connection and therefore we're not actually complete */
    *completep = 0;
  }

  if(ftp->transfer <= PPTRANSFER_INFO) {
    /* a transfer is about to take place, or if not a file name was given
       so we'll do a SIZE on it later and then we need the right TYPE first */

    if(ftpc->wait_data_conn == TRUE) {
      bool serv_conned;

      result = ReceivedServerConnect(data, &serv_conned);
      if(result)
        return result; /* Failed to accept data connection */

      if(serv_conned) {
        /* It looks data connection is established */
        result = AcceptServerConnect(data);
        ftpc->wait_data_conn = FALSE;
        if(!result)
          result = InitiateTransfer(data);

        if(result)
          return result;

        *completep = 1; /* this state is now complete when the server has
                           connected back to us */
      }
    }
    else if(data->set.upload) {
      result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                           FTP_STOR_TYPE);
      if(result)
        return result;

      result = ftp_multi_statemach(data, &complete);
      if(ftpc->wait_data_conn)
        /* if we reach the end of the FTP state machine here, *complete will be
           TRUE but so is ftpc->wait_data_conn, which says we need to wait for
           the data connection and therefore we're not actually complete */
        *completep = 0;
      else
        *completep = (int)complete;
    }
    else {
      /* download */
      ftp->downloadsize = -1; /* unknown as of yet */

      result = Curl_range(data);

      if(result == CURLE_OK && data->req.maxdownload >= 0) {
        /* Don't check for successful transfer */
        ftpc->dont_check = TRUE;
      }

      if(result)
        ;
      else if(data->state.list_only || !ftpc->file) {
        /* The specified path ends with a slash, and therefore we think this
           is a directory that is requested, use LIST. But before that we
           need to set ASCII transfer mode. */

        /* But only if a body transfer was requested. */
        if(ftp->transfer == PPTRANSFER_BODY) {
          result = ftp_nb_type(data, conn, TRUE, FTP_LIST_TYPE);
          if(result)
            return result;
        }
        /* otherwise just fall through */
      }
      else {
        result = ftp_nb_type(data, conn, data->state.prefer_ascii,
                             FTP_RETR_TYPE);
        if(result)
          return result;
      }

      result = ftp_multi_statemach(data, &complete);
      *completep = (int)complete;
    }
    return result;
  }

  /* no data to transfer */
  Curl_setup_transfer(data, -1, -1, FALSE, -1);

  if(!ftpc->wait_data_conn) {
    /* no waiting for the data connection so this is now complete */
    *completep = 1;
    DEBUGF(infof(data, "DO-MORE phase ends with %d", (int)result));
  }

  return result;
}